

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plistgenerator.cpp
# Opt level: O0

bool chibi::generate_plist(char *template_filename,char *app_name,int flags,string *out_text)

{
  undefined1 local_68 [8];
  StringBuilder sb;
  size_t template_size;
  char *template_text;
  FILE *template_file;
  bool result;
  string *out_text_local;
  int flags_local;
  char *app_name_local;
  char *template_filename_local;
  
  sb._24_8_ = 0;
  StringBuilder::StringBuilder((StringBuilder *)local_68);
  StringBuilder::Append((StringBuilder *)local_68,header_text);
  StringBuilder::Append((StringBuilder *)local_68,body_text);
  StringBuilder::Append((StringBuilder *)local_68,"<key>CFBundleExecutable</key>\n");
  StringBuilder::AppendFormat((StringBuilder *)local_68,"<string>%s</string>\n",app_name);
  if ((flags & 1U) != 0) {
    StringBuilder::Append((StringBuilder *)local_68,"<key>NSHighResolutionCapable</key>\n");
    StringBuilder::Append((StringBuilder *)local_68,"<true/>\n");
  }
  if ((flags & 2U) != 0) {
    StringBuilder::Append((StringBuilder *)local_68,"<key>NSMicrophoneUsageDescription</key>\n");
    StringBuilder::Append
              ((StringBuilder *)local_68,
               "<string>This application needs access to your Microphone.</string>\n");
  }
  if ((flags & 4U) != 0) {
    StringBuilder::Append((StringBuilder *)local_68,"<key>NSCameraUsageDescription</key>\n");
    StringBuilder::Append
              ((StringBuilder *)local_68,
               "<string>This application needs access to your Camera.</string>\n");
  }
  StringBuilder::Append((StringBuilder *)local_68,"<key>LSMinimumSystemVersion</key>\n");
  StringBuilder::Append((StringBuilder *)local_68,"<string>10.11</string>\n");
  StringBuilder::Append((StringBuilder *)local_68,footer_text);
  std::__cxx11::string::operator=((string *)out_text,(string *)local_68);
  StringBuilder::~StringBuilder((StringBuilder *)local_68);
  return true;
}

Assistant:

bool generate_plist(
		const char * template_filename,
		const char * app_name,
		const int flags,
		std::string & out_text)
	{
		bool result = false;

		FILE * template_file = nullptr;
		char * template_text = nullptr;
		size_t template_size = 0;

		StringBuilder sb;

	#if TEMPLATE_FROM_FILE
		if (template_filename != nullptr)
		{
			template_file = fopen(template_filename, "rt");

			if (template_file == nullptr)
				goto cleanup;

			struct stat buffer;
			if (fstat(fileno(template_file), &buffer) != 0)
				goto cleanup;
		
			template_size = (size_t)buffer.st_size;

			template_text = new char[template_size + 1];
			
			if (fread(template_text, 1, template_size, template_file) != template_size)
				goto cleanup;

			template_text[template_size] = 0;

			fclose(template_file);
			template_file = nullptr;
		}
	#endif

		// add header

		sb.Append(header_text);
		
		// add body
		
		sb.Append(body_text);

		// add template text

		if (template_text != nullptr)
		{
			sb.Append(template_text);
			sb.Append("\n");
		}

		// add the executable name key. this is needed for MacOS to find the executable
		// within an app bundle in case the app bundle gets renamed

		sb.Append("<key>CFBundleExecutable</key>\n");
		sb.AppendFormat("<string>%s</string>\n", app_name);

		// add keys based on flags

		if (flags & kPlistFlag_HighDpi)
		{
			sb.Append("<key>NSHighResolutionCapable</key>\n");
			sb.Append("<true/>\n");
		}

		if (flags & kPlistFlag_AccessMicrophone)
		{
			sb.Append("<key>NSMicrophoneUsageDescription</key>\n");
			sb.Append("<string>This application needs access to your Microphone.</string>\n");
		}

		if (flags & kPlistFlag_AccessWebcam)
		{
			sb.Append("<key>NSCameraUsageDescription</key>\n");
			sb.Append("<string>This application needs access to your Camera.</string>\n");
		}
		
		sb.Append("<key>LSMinimumSystemVersion</key>\n");
		sb.Append("<string>10.11</string>\n");

		// add footer

		sb.Append(footer_text);
		
		// done!

		out_text = sb.text;
		
		result = true;

#if TEMPLATE_FROM_FILE
	cleanup:
#endif
		delete [] template_text;
		template_text = nullptr;

		if (template_file != nullptr)
		{
			fclose(template_file);
			template_file = nullptr;
		}

		return result;
	}